

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIListBox * __thiscall
irr::gui::CGUIEnvironment::addListBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id,bool drawBackground
          )

{
  int iVar1;
  CGUIListBox *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IGUISkin *pIVar2;
  undefined8 uVar3;
  IGUIElement *parent_00;
  long lStack_40;
  undefined4 extraout_var_02;
  
  this_00 = (CGUIListBox *)operator_new(0x1d0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIListBox::CGUIListBox
            (this_00,&this->super_IGUIEnvironment,parent_00,id,*rectangle,true,drawBackground,false)
  ;
  if (this->CurrentSkin == (IGUISkin *)0x0) {
LAB_0022c9ee:
    iVar1 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    if (CONCAT44(extraout_var_00,iVar1) == 0) goto LAB_0022ca3f;
    iVar1 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x18))
                      ((long *)CONCAT44(extraout_var_01,iVar1));
    if (iVar1 != 0) goto LAB_0022ca3f;
    iVar1 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    pIVar2 = (IGUISkin *)CONCAT44(extraout_var_02,iVar1);
    lStack_40 = 0x58;
  }
  else {
    iVar1 = (*this->CurrentSkin->_vptr_IGUISkin[8])();
    if (CONCAT44(extraout_var,iVar1) == 0) goto LAB_0022c9ee;
    pIVar2 = this->CurrentSkin;
    lStack_40 = 0x40;
  }
  uVar3 = (**(code **)((long)pIVar2->_vptr_IGUISkin + lStack_40))();
  (**(code **)(*(long *)this_00 + 0x158))(this_00,uVar3);
LAB_0022ca3f:
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUIListBox *)this_00;
}

Assistant:

IGUIListBox *CGUIEnvironment::addListBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id, bool drawBackground)
{
	IGUIListBox *b = new CGUIListBox(this, parent ? parent : this, id, rectangle,
			true, drawBackground, false);

	if (CurrentSkin && CurrentSkin->getSpriteBank()) {
		b->setSpriteBank(CurrentSkin->getSpriteBank());
	} else if (getBuiltInFont() && getBuiltInFont()->getType() == EGFT_BITMAP) {
		b->setSpriteBank(((IGUIFontBitmap *)getBuiltInFont())->getSpriteBank());
	}

	b->drop();
	return b;
}